

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::run(search *sch,multi_ex *ec)

{
  void *pvVar1;
  ostream *poVar2;
  stringstream *psVar3;
  bool isLdf;
  ulong uVar4;
  unsigned_long local_60;
  v_array<unsigned_long> local_58;
  
  pvVar1 = sch->task_data;
  local_58.end_array = (unsigned_long *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (unsigned_long *)0x0;
  local_58._end = (unsigned_long *)0x0;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      local_60 = 0;
      v_array<unsigned_long>::push_back(&local_58,&local_60);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  switch(*(undefined8 *)((long)pvVar1 + 0x58)) {
  case 0:
    isLdf = false;
    goto LAB_00265b1f;
  case 1:
    er_mixed_decoding(sch,ec,&local_58);
    break;
  case 2:
    er_allow_skip_decoding(sch,ec,&local_58);
    break;
  case 3:
    isLdf = true;
LAB_00265b1f:
    entity_first_decoding(sch,ec,&local_58,isLdf);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"search order ",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"is undefined.",0xd);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      psVar3 = Search::search::output_abi_cxx11_(sch);
      if (*(int *)(psVar3 + *(long *)(*(long *)psVar3 + -0x18) + 0x20) == 0) {
        psVar3 = Search::search::output_abi_cxx11_(sch);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar3 + 0x10));
        local_60 = CONCAT71(local_60._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_60,1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_58._begin != (unsigned_long *)0x0) {
    free(local_58._begin);
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();

  v_array<size_t> predictions = v_init<size_t>();
  for (size_t i = 0; i < ec.size(); i++)
  {
    predictions.push_back(0);
  }

  switch (my_task_data->search_order)
  {
    case 0:
      entity_first_decoding(sch, ec, predictions, false);
      break;
    case 1:
      er_mixed_decoding(sch, ec, predictions);
      break;
    case 2:
      er_allow_skip_decoding(sch, ec, predictions);
      break;
    case 3:
      entity_first_decoding(sch, ec, predictions, true);  // LDF = true
      break;
    default:
      cerr << "search order " << my_task_data->search_order << "is undefined." << endl;
  }

  for (size_t i = 0; i < ec.size(); i++)
  {
    if (sch.output().good())
      sch.output() << predictions[i] << ' ';
  }
  predictions.delete_v();
}